

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobject.cpp
# Opt level: O3

PAL_ERROR __thiscall
CorUnix::CSharedMemoryObject::EnsureObjectIsShared(CSharedMemoryObject *this,CPalThread *pthr)

{
  PAL_ERROR PVar1;
  CSimpleDataLock *pCVar2;
  SHMPTR local_40;
  SHMPTR shmObjData;
  SHMObjData *psmod;
  
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","EnsureObjectIsShared",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
            ,0x21f);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    SHMLock();
    PVar1 = 0;
    if (this->m_ObjectDomain != SharedObject) {
      if (((this->super_CPalObjectBase).m_pot)->m_dwSharedDataSize == 0) {
        pCVar2 = (CSimpleDataLock *)0x0;
      }
      else {
        pCVar2 = &this->m_sdlSharedData;
        InternalEnterCriticalSection(pthr,&(this->m_sdlSharedData).m_cs);
      }
      PVar1 = AllocateSharedDataItems(this,&local_40,(SHMObjData **)&shmObjData);
      if (PVar1 == 0) {
        PromoteSharedData(this,local_40,(SHMObjData *)shmObjData);
        this->m_ObjectDomain = SharedObject;
      }
      if (pCVar2 != (CSimpleDataLock *)0x0) {
        (**(pCVar2->super_IDataLock)._vptr_IDataLock)(pCVar2,pthr,1);
      }
    }
    SHMRelease();
    if (PAL_InitializeChakraCoreCalled != false) {
      return PVar1;
    }
  }
  abort();
}

Assistant:

PAL_ERROR
CSharedMemoryObject::EnsureObjectIsShared(
    CPalThread *pthr
    )
{
    PAL_ERROR palError = NO_ERROR;
    IDataLock *pDataLock = NULL;
    SHMPTR shmObjData;
    SHMObjData *psmod;

    _ASSERTE(NULL != pthr);

    ENTRY("CSharedMemoryObject::EnsureObjectIsShared"
        "(this = %p, pthr = %p)\n",
        this,
        pthr
        );

    //
    // Grab the shared memory lock and check if the object is already
    // shared
    //
    
    SHMLock();

    if (SharedObject == m_ObjectDomain)
    {
        goto EnsureObjectIsSharedExit;
    }

    //
    // Grab the local shared data lock, if necessary
    //
    
    if (0 != m_pot->GetSharedDataSize())
    {
        m_sdlSharedData.AcquireLock(pthr, &pDataLock);
    }

    //
    // Allocate the necessary shared data areas
    //

    palError = AllocateSharedDataItems(&shmObjData, &psmod);
    if (NO_ERROR != palError)
    {
        goto EnsureObjectIsSharedExit;
    }

    //
    // Promote the object's data and set the domain to shared
    //

    PromoteSharedData(shmObjData, psmod);
    m_ObjectDomain = SharedObject;

EnsureObjectIsSharedExit:

    if (NULL != pDataLock)
    {
        pDataLock->ReleaseLock(pthr, TRUE);
    }

    SHMRelease();

    LOGEXIT("CSharedMemoryObject::EnsureObjectIsShared returns %d\n", palError);

    return palError;    
}